

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v6::detail::
       parse_format_specs<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  char *begin_00;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == '}') {
    return begin;
  }
  begin_00 = parse_align<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                       (begin,end,handler);
  if (begin_00 == end) {
    return begin_00;
  }
  cVar1 = *begin_00;
  if (cVar1 == ' ') {
    specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
    ::on_space(handler);
  }
  else if (cVar1 == '-') {
    specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
    ::on_minus(handler);
  }
  else {
    if (cVar1 != '+') goto LAB_0010ced7;
    specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
    ::on_plus(handler);
  }
  begin_00 = begin_00 + 1;
LAB_0010ced7:
  if (begin_00 != end) {
    cVar1 = *begin_00;
    if (cVar1 == '#') {
      specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
      ::on_hash(handler);
      begin_00 = begin_00 + 1;
      if (begin_00 == end) {
        return begin_00;
      }
      cVar1 = *begin_00;
    }
    if (cVar1 == '0') {
      specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
      ::on_zero(handler);
      begin_00 = begin_00 + 1;
      if (begin_00 == end) {
        return begin_00;
      }
    }
    begin_00 = parse_width<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                         (begin_00,end,handler);
    if (begin_00 != end) {
      if (*begin_00 == '.') {
        begin_00 = parse_precision<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                             (begin_00,end,handler);
      }
      if ((begin_00 != end) && (cVar1 = *begin_00, cVar1 != '}')) {
        begin_00 = begin_00 + 1;
        ((handler->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->type = cVar1;
      }
    }
  }
  return begin_00;
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end || *begin == '}') return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}